

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O2

int __thiscall SocketClient::init(SocketClient *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint __domain;
  int iVar5;
  element_type *peVar6;
  SharedPtr loop;
  function<void_(int,_unsigned_int)> local_58;
  _Bind<void_(SocketClient::*(SocketClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>
  local_38;
  
  uVar4 = (uint)ctx;
  uVar2 = uVar4 & 7;
  if (uVar2 == 1) {
    uVar2 = 1;
  }
  else {
    if (uVar2 == 4) {
      if (((ulong)ctx & 8) != 0) {
        __assert_fail("!(mode & IPv6)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                      ,0x309,"bool SocketClient::init(unsigned int)");
      }
      uVar2 = 1;
      __domain = uVar2;
      goto LAB_00181bf3;
    }
    if (uVar2 != 2) {
      uVar2 = 0xffffffff;
      __domain = uVar2;
      goto LAB_00181bf3;
    }
    uVar2 = 2;
  }
  __domain = uVar4 & 8 | 2;
LAB_00181bf3:
  iVar5 = 0;
  iVar3 = socket(__domain,uVar2,0);
  this->mFd = iVar3;
  if (-1 < iVar3) {
    setFlags(iVar3,1,1,2,FlagAppend);
    peVar6 = (element_type *)0x0;
    if (this->mBlocking == false) {
      EventLoop::eventLoop();
      if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        iVar3 = this->mFd;
        local_38._M_f = (offset_in_SocketClient_to_subr)socketCallback;
        local_38._8_8_ = 0;
        local_38._M_bound_args.
        super__Tuple_impl<0UL,_SocketClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
        super__Head_base<0UL,_SocketClient_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_SocketClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
             (_Tuple_impl<0UL,_SocketClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
        std::function<void(int,unsigned_int)>::
        function<std::_Bind<void(SocketClient::*(SocketClient*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                  ((function<void(int,unsigned_int)> *)&local_58,&local_38);
        EventLoop::registerSocket
                  (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar3,1,
                   &local_58);
        std::_Function_base::~_Function_base(&local_58.super__Function_base);
        iVar3 = 0x800;
        bVar1 = setFlags(this->mFd,0x800,3,4,FlagAppend);
        if (!bVar1) {
          close(this,iVar3);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          return 0;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar6 = loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    this->mSocketMode = uVar4;
    iVar5 = (int)CONCAT71((int7)((ulong)peVar6 >> 8),1);
  }
  return iVar5;
}

Assistant:

bool SocketClient::init(unsigned int mode)
{
    int domain = -1, type = -1;
    switch (mode & (Udp|Tcp|Unix)) {
    case Udp:
        type = SOCK_DGRAM;
        domain = (mode & IPv6) ? AF_INET6 : AF_INET;
        break;
    case Tcp:
        type = SOCK_STREAM;
        domain = (mode & IPv6) ? AF_INET6 : AF_INET;
        break;
    case Unix:
        type = SOCK_STREAM;
        assert(!(mode & IPv6));
        domain = PF_UNIX;
        break;
    }

    mFd = ::socket(domain, type, 0);
    if (mFd < 0) {
        // bad
        return false;
    }
#ifdef HAVE_NOSIGPIPE
    int flags = 1;
    ::setsockopt(mFd, SOL_SOCKET, SO_NOSIGPIPE, (void *)&flags, sizeof(int));
#endif
#ifdef HAVE_CLOEXEC
    setFlags(mFd, FD_CLOEXEC, F_GETFD, F_SETFD);
#endif

    if (!mBlocking) {
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->registerSocket(mFd, EventLoop::SocketRead,
                                 std::bind(&SocketClient::socketCallback, this, std::placeholders::_1, std::placeholders::_2));
#ifndef _WIN32   // no O_NONBLOCK on windows
            if (!setFlags(mFd, O_NONBLOCK, F_GETFL, F_SETFL)) {
                close();
                return false;
            }
#endif
        }
    }

    mSocketMode = mode;
    return true;
}